

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303D.cpp
# Opt level: O0

bool __thiscall RTIMUGD20HM303D::setCompassCTRL6(RTIMUGD20HM303D *this)

{
  bool bVar1;
  uchar local_19;
  uchar ctrl6;
  RTIMUGD20HM303D *this_local;
  
  switch(((this->super_RTIMU).m_settings)->m_GD20HM303DCompassFsr) {
  case 0:
    local_19 = '\0';
    this->m_compassScale = 0.008;
    break;
  case 1:
    local_19 = ' ';
    this->m_compassScale = 0.016;
    break;
  case 2:
    local_19 = '@';
    this->m_compassScale = 0.032;
    break;
  case 3:
    local_19 = '`';
    this->m_compassScale = 0.0479;
    break;
  default:
    fprintf(_stderr,"Illegal LSM303D compass FSR code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_GD20HM303DCompassFsr);
    return false;
  }
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                             this->m_accelCompassSlaveAddr,'%',local_19,
                             "Failed to set LSM303D CTRL6");
  return bVar1;
}

Assistant:

bool RTIMUGD20HM303D::setCompassCTRL6()
{
    unsigned char ctrl6;

    //  convert FSR to uT

    switch (m_settings->m_GD20HM303DCompassFsr) {
    case LSM303D_COMPASS_FSR_2:
        ctrl6 = 0;
        m_compassScale = (RTFLOAT)0.008;
        break;

    case LSM303D_COMPASS_FSR_4:
        ctrl6 = 0x20;
        m_compassScale = (RTFLOAT)0.016;
        break;

    case LSM303D_COMPASS_FSR_8:
        ctrl6 = 0x40;
        m_compassScale = (RTFLOAT)0.032;
        break;

    case LSM303D_COMPASS_FSR_12:
        ctrl6 = 0x60;
        m_compassScale = (RTFLOAT)0.0479;
        break;

    default:
        HAL_ERROR1("Illegal LSM303D compass FSR code %d\n", m_settings->m_GD20HM303DCompassFsr);
        return false;
    }

    return m_settings->HALWrite(m_accelCompassSlaveAddr,  LSM303D_CTRL6, ctrl6, "Failed to set LSM303D CTRL6");
}